

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

MPP_RET mpp_enc_proc_hw_cfg(MppEncHwCfg *dst,MppEncHwCfg *src)

{
  uint uVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  MppEncHwCfg bak;
  undefined1 local_1dc [452];
  
  uVar1 = src->change;
  if (uVar1 != 0) {
    memcpy(local_1dc,dst,0x1c4);
    if ((uVar1 & 1) != 0) {
      dst->qp_delta_row = src->qp_delta_row;
    }
    if ((uVar1 & 2) != 0) {
      dst->qp_delta_row_i = src->qp_delta_row_i;
    }
    if ((uVar1 & 4) != 0) {
      RVar2 = src->aq_thrd_i[0];
      RVar3 = src->aq_thrd_i[1];
      RVar4 = src->aq_thrd_i[2];
      RVar5 = src->aq_thrd_i[3];
      uVar10 = *(undefined8 *)(src->aq_thrd_i + 4);
      uVar11 = *(undefined8 *)(src->aq_thrd_i + 6);
      uVar12 = *(undefined8 *)(src->aq_thrd_i + 8);
      uVar13 = *(undefined8 *)(src->aq_thrd_i + 10);
      uVar14 = *(undefined8 *)(src->aq_thrd_i + 0xe);
      *(undefined8 *)(dst->aq_thrd_i + 0xc) = *(undefined8 *)(src->aq_thrd_i + 0xc);
      *(undefined8 *)(dst->aq_thrd_i + 0xe) = uVar14;
      *(undefined8 *)(dst->aq_thrd_i + 8) = uVar12;
      *(undefined8 *)(dst->aq_thrd_i + 10) = uVar13;
      *(undefined8 *)(dst->aq_thrd_i + 4) = uVar10;
      *(undefined8 *)(dst->aq_thrd_i + 6) = uVar11;
      dst->aq_thrd_i[0] = RVar2;
      dst->aq_thrd_i[1] = RVar3;
      dst->aq_thrd_i[2] = RVar4;
      dst->aq_thrd_i[3] = RVar5;
    }
    if ((uVar1 & 8) != 0) {
      RVar2 = src->aq_thrd_p[0];
      RVar3 = src->aq_thrd_p[1];
      RVar4 = src->aq_thrd_p[2];
      RVar5 = src->aq_thrd_p[3];
      uVar10 = *(undefined8 *)(src->aq_thrd_p + 4);
      uVar11 = *(undefined8 *)(src->aq_thrd_p + 6);
      uVar12 = *(undefined8 *)(src->aq_thrd_p + 8);
      uVar13 = *(undefined8 *)(src->aq_thrd_p + 10);
      uVar14 = *(undefined8 *)(src->aq_thrd_p + 0xe);
      *(undefined8 *)(dst->aq_thrd_p + 0xc) = *(undefined8 *)(src->aq_thrd_p + 0xc);
      *(undefined8 *)(dst->aq_thrd_p + 0xe) = uVar14;
      *(undefined8 *)(dst->aq_thrd_p + 8) = uVar12;
      *(undefined8 *)(dst->aq_thrd_p + 10) = uVar13;
      *(undefined8 *)(dst->aq_thrd_p + 4) = uVar10;
      *(undefined8 *)(dst->aq_thrd_p + 6) = uVar11;
      dst->aq_thrd_p[0] = RVar2;
      dst->aq_thrd_p[1] = RVar3;
      dst->aq_thrd_p[2] = RVar4;
      dst->aq_thrd_p[3] = RVar5;
    }
    if ((uVar1 & 0x10) != 0) {
      RVar6 = src->aq_step_i[0];
      RVar7 = src->aq_step_i[1];
      RVar8 = src->aq_step_i[2];
      RVar9 = src->aq_step_i[3];
      uVar10 = *(undefined8 *)(src->aq_step_i + 4);
      uVar11 = *(undefined8 *)(src->aq_step_i + 6);
      uVar12 = *(undefined8 *)(src->aq_step_i + 8);
      uVar13 = *(undefined8 *)(src->aq_step_i + 10);
      uVar14 = *(undefined8 *)(src->aq_step_i + 0xe);
      *(undefined8 *)(dst->aq_step_i + 0xc) = *(undefined8 *)(src->aq_step_i + 0xc);
      *(undefined8 *)(dst->aq_step_i + 0xe) = uVar14;
      *(undefined8 *)(dst->aq_step_i + 8) = uVar12;
      *(undefined8 *)(dst->aq_step_i + 10) = uVar13;
      *(undefined8 *)(dst->aq_step_i + 4) = uVar10;
      *(undefined8 *)(dst->aq_step_i + 6) = uVar11;
      dst->aq_step_i[0] = RVar6;
      dst->aq_step_i[1] = RVar7;
      dst->aq_step_i[2] = RVar8;
      dst->aq_step_i[3] = RVar9;
    }
    if ((uVar1 & 0x20) != 0) {
      RVar6 = src->aq_step_p[0];
      RVar7 = src->aq_step_p[1];
      RVar8 = src->aq_step_p[2];
      RVar9 = src->aq_step_p[3];
      uVar10 = *(undefined8 *)(src->aq_step_p + 4);
      uVar11 = *(undefined8 *)(src->aq_step_p + 6);
      uVar12 = *(undefined8 *)(src->aq_step_p + 8);
      uVar13 = *(undefined8 *)(src->aq_step_p + 10);
      uVar14 = *(undefined8 *)(src->aq_step_p + 0xe);
      *(undefined8 *)(dst->aq_step_p + 0xc) = *(undefined8 *)(src->aq_step_p + 0xc);
      *(undefined8 *)(dst->aq_step_p + 0xe) = uVar14;
      *(undefined8 *)(dst->aq_step_p + 8) = uVar12;
      *(undefined8 *)(dst->aq_step_p + 10) = uVar13;
      *(undefined8 *)(dst->aq_step_p + 4) = uVar10;
      *(undefined8 *)(dst->aq_step_p + 6) = uVar11;
      dst->aq_step_p[0] = RVar6;
      dst->aq_step_p[1] = RVar7;
      dst->aq_step_p[2] = RVar8;
      dst->aq_step_p[3] = RVar9;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      dst->qbias_i = src->qbias_i;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      dst->qbias_p = src->qbias_p;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      dst->qbias_en = src->qbias_en;
    }
    if ((uVar1 & 0x40) != 0) {
      dst->mb_rc_disable = src->mb_rc_disable;
    }
    if ((uVar1 >> 8 & 1) != 0) {
      RVar6 = src->mode_bias[0];
      RVar7 = src->mode_bias[1];
      RVar8 = src->mode_bias[2];
      RVar9 = src->mode_bias[3];
      uVar10 = *(undefined8 *)(src->mode_bias + 6);
      *(undefined8 *)(dst->mode_bias + 4) = *(undefined8 *)(src->mode_bias + 4);
      *(undefined8 *)(dst->mode_bias + 6) = uVar10;
      dst->mode_bias[0] = RVar6;
      dst->mode_bias[1] = RVar7;
      dst->mode_bias[2] = RVar8;
      dst->mode_bias[3] = RVar9;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      RVar6 = src->skip_sad;
      dst->skip_bias_en = src->skip_bias_en;
      dst->skip_sad = RVar6;
      dst->skip_bias = src->skip_bias;
    }
    if ((dst->qp_delta_row | dst->qp_delta_row_i) < 0) {
      _mpp_log_l(2,"mpp_enc","invalid hw qp delta row [%d:%d]\n",(char *)0x0);
      dst->change = dst->change | uVar1;
      _mpp_log_l(2,"mpp_enc","failed to accept new hw config\n","mpp_enc_proc_hw_cfg");
      memcpy(dst,local_1dc,0x1c4);
      return MPP_ERR_VALUE;
    }
    dst->change = dst->change | uVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_enc_proc_hw_cfg(MppEncHwCfg *dst, MppEncHwCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncHwCfg bak = *dst;

        if (change & MPP_ENC_HW_CFG_CHANGE_QP_ROW)
            dst->qp_delta_row = src->qp_delta_row;

        if (change & MPP_ENC_HW_CFG_CHANGE_QP_ROW_I)
            dst->qp_delta_row_i = src->qp_delta_row_i;

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_THRD_I)
            memcpy(dst->aq_thrd_i, src->aq_thrd_i, sizeof(dst->aq_thrd_i));

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_THRD_P)
            memcpy(dst->aq_thrd_p, src->aq_thrd_p, sizeof(dst->aq_thrd_p));

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_STEP_I)
            memcpy(dst->aq_step_i, src->aq_step_i, sizeof(dst->aq_step_i));

        if (change & MPP_ENC_HW_CFG_CHANGE_AQ_STEP_P)
            memcpy(dst->aq_step_p, src->aq_step_p, sizeof(dst->aq_step_p));

        if (change & MPP_ENC_HW_CFG_CHANGE_QBIAS_I)
            dst->qbias_i = src->qbias_i;

        if (change & MPP_ENC_HW_CFG_CHANGE_QBIAS_P)
            dst->qbias_p = src->qbias_p;

        if (change & MPP_ENC_HW_CFG_CHANGE_QBIAS_EN)
            dst->qbias_en = src->qbias_en;

        if (change & MPP_ENC_HW_CFG_CHANGE_MB_RC)
            dst->mb_rc_disable = src->mb_rc_disable;

        if (change & MPP_ENC_HW_CFG_CHANGE_CU_MODE_BIAS)
            memcpy(dst->mode_bias, src->mode_bias, sizeof(dst->mode_bias));

        if (change & MPP_ENC_HW_CFG_CHANGE_CU_SKIP_BIAS) {
            dst->skip_bias_en = src->skip_bias_en;
            dst->skip_sad = src->skip_sad;
            dst->skip_bias = src->skip_bias;
        }

        if (dst->qp_delta_row < 0 || dst->qp_delta_row_i < 0) {
            mpp_err("invalid hw qp delta row [%d:%d]\n",
                    dst->qp_delta_row_i, dst->qp_delta_row);
            ret = MPP_ERR_VALUE;
        }

        dst->change |= change;

        if (ret) {
            mpp_err_f("failed to accept new hw config\n");
            *dst = bak;
        }
    }

    return ret;
}